

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::
GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_ba;
  allocator local_b9;
  LogicalType local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  LogicalType local_88;
  string local_70;
  LogicalType local_50;
  LogicalType struct_type;
  
  LogicalType::LogicalType(&local_50,(LogicalType *)this);
  LogicalType::LogicalType(&local_88,UBIGINT);
  LogicalType::MAP(&struct_type,&local_50,&local_88);
  LogicalType::~LogicalType(&local_88);
  LogicalType::~LogicalType(&local_50);
  ::std::__cxx11::string::string((string *)&local_70,"histogram",&local_b9);
  LogicalType::LogicalType(&local_b8,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_b8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,&local_ba);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,&local_70,(vector<duckdb::LogicalType,_true> *)&local_a0,
             &struct_type,
             AggregateFunction::
             StateSize<duckdb::HistogramAggState<unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
             ,AggregateFunction::
              StateInitialize<duckdb::HistogramAggState<unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>,(duckdb::AggregateDestructorType)0>
             ,
             HistogramUpdateFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
             ,AggregateFunction::
              StateCombine<duckdb::HistogramAggState<unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>>
             ,
             HistogramFinalizeFunction<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
             ,(aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::HistogramAggState<unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  LogicalType::~LogicalType(&local_b8);
  ::std::__cxx11::string::~string((string *)&local_70);
  LogicalType::~LogicalType(&struct_type);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetMapTypeInternal(const LogicalType &type) {
	return GetHistogramFunction<OP, T, MAP_TYPE>(type);
}